

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O1

char * u_austrncpy_63(char *s1,UChar *ucs2,int32_t n)

{
  UConverter *converter;
  char *pcVar1;
  long lVar2;
  long lVar3;
  UErrorCode err;
  char *target;
  UChar *ucs2_local;
  
  err = U_ZERO_ERROR;
  target = s1;
  ucs2_local = ucs2;
  converter = u_getDefaultConverter_63(&err);
  pcVar1 = s1;
  if (converter != (UConverter *)0x0 && err < U_ILLEGAL_ARGUMENT_ERROR) {
    ucnv_reset_63(converter);
    lVar3 = (long)n;
    if (n == 0 || ucs2_local == (UChar *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      do {
        if (ucs2_local[lVar2] == L'\0') {
          n = (int32_t)lVar2;
          break;
        }
        lVar2 = lVar2 + 1;
      } while (n != (int)lVar2);
      lVar2 = (long)n;
    }
    ucnv_fromUnicode_63(converter,&target,s1 + lVar3,&ucs2_local,ucs2_local + lVar2,(int32_t *)0x0,
                        '\x01',&err);
    ucnv_reset_63(converter);
    u_releaseDefaultConverter_63(converter);
    if (err != U_BUFFER_OVERFLOW_ERROR && U_ZERO_ERROR < err) {
      *s1 = '\0';
    }
    pcVar1 = target;
    if (s1 + lVar3 <= target) {
      return s1;
    }
  }
  *pcVar1 = '\0';
  return s1;
}

Assistant:

U_CAPI char*  U_EXPORT2
u_austrncpy(char *s1,
        const UChar *ucs2,
        int32_t n)
{
  char *target = s1;
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_reset(cnv);
    ucnv_fromUnicode(cnv,
                  &target,
                  s1+n,
                  &ucs2,
                  ucs2+u_ustrnlen(ucs2, n),
                  NULL,
                  TRUE,
                  &err);
    ucnv_reset(cnv); /* be good citizens */
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err) && (err != U_BUFFER_OVERFLOW_ERROR) ) {
      *s1 = 0; /* failure */
    }
    if(target < (s1+n)) { /* U_BUFFER_OVERFLOW_ERROR isn't an err, just means no termination will happen. */
      *target = 0;  /* terminate */
    }
  } else {
    *s1 = 0;
  }
  return s1;
}